

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_container_equals(bitset_container_t *container1,bitset_container_t *container2)

{
  uint uVar1;
  int iVar2;
  int *in_RSI;
  int *in_RDI;
  int support;
  bitset_container_t *in_stack_000000a8;
  bitset_container_t *in_stack_000000b0;
  bitset_container_t *in_stack_000000d8;
  bitset_container_t *in_stack_000000e0;
  _Bool local_1;
  
  if ((*in_RDI != -1) && (*in_RSI != -1)) {
    if (*in_RDI != *in_RSI) {
      return false;
    }
    if (*in_RDI == 0x10000) {
      return true;
    }
  }
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 2) == 0) {
    if ((uVar1 & 1) == 0) {
      iVar2 = memcmp(*(void **)(in_RDI + 2),*(void **)(in_RSI + 2),0x2000);
      local_1 = iVar2 == 0;
    }
    else {
      local_1 = _avx2_bitset_container_equals(in_stack_000000b0,in_stack_000000a8);
    }
  }
  else {
    local_1 = _avx512_bitset_container_equals(in_stack_000000e0,in_stack_000000d8);
  }
  return local_1;
}

Assistant:

ALLOW_UNALIGNED
bool bitset_container_equals(const bitset_container_t *container1, const bitset_container_t *container2) {
  if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
    if(container1->cardinality != container2->cardinality) {
      return false;
    }
    if (container1->cardinality == INT32_C(0x10000)) {
      return true;
    }
  }
#if CROARING_IS_X64
  int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
  if( support & ROARING_SUPPORTS_AVX512 ) {
    return _avx512_bitset_container_equals(container1, container2);
  }
  else
#endif
  if( support & ROARING_SUPPORTS_AVX2 ) {
    return _avx2_bitset_container_equals(container1, container2);
  }
#endif
  return memcmp(container1->words,
                container2->words,
                BITSET_CONTAINER_SIZE_IN_WORDS*sizeof(uint64_t)) == 0;
}